

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O2

void __thiscall
SaltedOutpointHasher::SaltedOutpointHasher(SaltedOutpointHasher *this,bool deterministic)

{
  undefined7 in_register_00000031;
  uint64_t uVar1;
  long in_FS_OFFSET;
  FastRandomContext local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,deterministic) == 0) {
    FastRandomContext::FastRandomContext(&local_a0,false);
    uVar1 = FastRandomContext::rand64(&local_a0);
    ChaCha20::~ChaCha20(&local_a0.rng);
    this->k0 = uVar1;
    FastRandomContext::FastRandomContext(&local_a0,false);
    uVar1 = FastRandomContext::rand64(&local_a0);
    ChaCha20::~ChaCha20(&local_a0.rng);
  }
  else {
    this->k0 = 0x8e819f2607a18de6;
    uVar1 = 0xf4020d2e3983b0eb;
  }
  this->k1 = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SaltedOutpointHasher::SaltedOutpointHasher(bool deterministic) :
    k0{deterministic ? 0x8e819f2607a18de6 : FastRandomContext().rand64()},
    k1{deterministic ? 0xf4020d2e3983b0eb : FastRandomContext().rand64()}
{}